

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(int button,bool repeat)

{
  float *pfVar1;
  float t_00;
  int iVar2;
  bool local_29;
  int amount;
  float t;
  ImGuiContext *g;
  bool repeat_local;
  int button_local;
  
  local_29 = 4 < (uint)button;
  if (local_29) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1164,"bool ImGui::IsMouseClicked(int, bool)");
  }
  t_00 = (GImGui->IO).MouseDownDuration[button];
  if ((t_00 != 0.0) || (NAN(t_00))) {
    if ((!repeat) ||
       ((pfVar1 = &(GImGui->IO).KeyRepeatDelay, t_00 < *pfVar1 || t_00 == *pfVar1 ||
        (iVar2 = CalcTypematicPressedRepeatAmount
                           (t_00,t_00 - (GImGui->IO).DeltaTime,(GImGui->IO).KeyRepeatDelay,
                            (GImGui->IO).KeyRepeatRate * 0.5), iVar2 < 1)))) {
      repeat_local = false;
    }
    else {
      repeat_local = true;
    }
  }
  else {
    repeat_local = true;
  }
  return repeat_local;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.5f);
        if (amount > 0)
            return true;
    }

    return false;
}